

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O3

void __thiscall CGV::visit(CGV *this,Calls *node)

{
  _Elt_pointer ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  _Map_pointer pppAVar3;
  _Elt_pointer ppAVar4;
  ASTNode **child;
  _Elt_pointer ppAVar5;
  
  pdVar2 = AST::ASTNode::getChildren(&node->super_ASTNode);
  ppAVar5 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppAVar1 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar5 != ppAVar1) {
    ppAVar4 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pppAVar3 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      (**(*ppAVar5)->_vptr_ASTNode)(*ppAVar5,this);
      ppAVar5 = ppAVar5 + 1;
      if (ppAVar5 == ppAVar4) {
        ppAVar5 = pppAVar3[1];
        pppAVar3 = pppAVar3 + 1;
        ppAVar4 = ppAVar5 + 0x40;
      }
    } while (ppAVar5 != ppAVar1);
  }
  return;
}

Assistant:

void CGV::visit(Calls *node) {
    for (auto &child : node->getChildren()) child->accept(*this);
}